

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O2

void __thiscall
proto2_unittest::TestHugeFieldNumbersLite_OptionalGroup::Clear
          (TestHugeFieldNumbersLite_OptionalGroup *this)

{
  (this->field_0)._impl_.group_a_ = 0;
  (this->field_0)._impl_._has_bits_.has_bits_[0] = 0;
  google::protobuf::internal::InternalMetadata::Clear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TestHugeFieldNumbersLite_OptionalGroup::Clear() {
// @@protoc_insertion_point(message_clear_start:proto2_unittest.TestHugeFieldNumbersLite.OptionalGroup)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_.group_a_ = 0;
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<std::string>();
}